

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pager_open_journal(Pager *pPager)

{
  sqlite3_vfs *pVfs_00;
  Bitvec *pBVar1;
  int local_30;
  int local_2c;
  int nSpill;
  int flags;
  sqlite3_vfs *pVfs;
  int rc;
  Pager *pPager_local;
  
  pVfs._4_4_ = 0;
  pVfs_00 = pPager->pVfs;
  if (pPager->errCode == 0) {
    if ((pPager->pWal == (Wal *)0x0) && (pPager->journalMode != '\x02')) {
      pBVar1 = sqlite3BitvecCreate(pPager->dbSize);
      pPager->pInJournal = pBVar1;
      if (pPager->pInJournal == (Bitvec *)0x0) {
        return 7;
      }
      if (pPager->jfd->pMethods == (sqlite3_io_methods *)0x0) {
        if (pPager->journalMode == '\x04') {
          sqlite3MemJournalOpen(pPager->jfd);
        }
        else {
          if (pPager->tempFile == '\0') {
            local_2c = 0x806;
            local_30 = jrnlBufferSize(pPager);
          }
          else {
            local_2c = 0x100e;
            local_30 = sqlite3Config.nStmtSpill;
          }
          pVfs._4_4_ = databaseIsUnmoved(pPager);
          if (pVfs._4_4_ == 0) {
            pVfs._4_4_ = sqlite3JournalOpen(pVfs_00,pPager->zJournal,pPager->jfd,local_2c,local_30);
          }
        }
      }
      if (pVfs._4_4_ == 0) {
        pPager->nRec = 0;
        pPager->journalOff = 0;
        pPager->setMaster = '\0';
        pPager->journalHdr = 0;
        pVfs._4_4_ = writeJournalHdr(pPager);
      }
    }
    if (pVfs._4_4_ == 0) {
      pPager->eState = '\x03';
    }
    else {
      sqlite3BitvecDestroy(pPager->pInJournal);
      pPager->pInJournal = (Bitvec *)0x0;
    }
    pPager_local._4_4_ = pVfs._4_4_;
  }
  else {
    pPager_local._4_4_ = pPager->errCode;
  }
  return pPager_local._4_4_;
}

Assistant:

static int pager_open_journal(Pager *pPager){
  int rc = SQLITE_OK;                        /* Return code */
  sqlite3_vfs * const pVfs = pPager->pVfs;   /* Local cache of vfs pointer */

  assert( pPager->eState==PAGER_WRITER_LOCKED );
  assert( assert_pager_state(pPager) );
  assert( pPager->pInJournal==0 );
  
  /* If already in the error state, this function is a no-op.  But on
  ** the other hand, this routine is never called if we are already in
  ** an error state. */
  if( NEVER(pPager->errCode) ) return pPager->errCode;

  if( !pagerUseWal(pPager) && pPager->journalMode!=PAGER_JOURNALMODE_OFF ){
    pPager->pInJournal = sqlite3BitvecCreate(pPager->dbSize);
    if( pPager->pInJournal==0 ){
      return SQLITE_NOMEM_BKPT;
    }
  
    /* Open the journal file if it is not already open. */
    if( !isOpen(pPager->jfd) ){
      if( pPager->journalMode==PAGER_JOURNALMODE_MEMORY ){
        sqlite3MemJournalOpen(pPager->jfd);
      }else{
        int flags = SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE;
        int nSpill;

        if( pPager->tempFile ){
          flags |= (SQLITE_OPEN_DELETEONCLOSE|SQLITE_OPEN_TEMP_JOURNAL);
          nSpill = sqlite3Config.nStmtSpill;
        }else{
          flags |= SQLITE_OPEN_MAIN_JOURNAL;
          nSpill = jrnlBufferSize(pPager);
        }
          
        /* Verify that the database still has the same name as it did when
        ** it was originally opened. */
        rc = databaseIsUnmoved(pPager);
        if( rc==SQLITE_OK ){
          rc = sqlite3JournalOpen (
              pVfs, pPager->zJournal, pPager->jfd, flags, nSpill
          );
        }
      }
      assert( rc!=SQLITE_OK || isOpen(pPager->jfd) );
    }
  
  
    /* Write the first journal header to the journal file and open 
    ** the sub-journal if necessary.
    */
    if( rc==SQLITE_OK ){
      /* TODO: Check if all of these are really required. */
      pPager->nRec = 0;
      pPager->journalOff = 0;
      pPager->setMaster = 0;
      pPager->journalHdr = 0;
      rc = writeJournalHdr(pPager);
    }
  }

  if( rc!=SQLITE_OK ){
    sqlite3BitvecDestroy(pPager->pInJournal);
    pPager->pInJournal = 0;
  }else{
    assert( pPager->eState==PAGER_WRITER_LOCKED );
    pPager->eState = PAGER_WRITER_CACHEMOD;
  }

  return rc;
}